

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_2dPoint ON_LiftInverse(ON_2dPoint P,ON_Interval *dom,bool *closed)

{
  int di;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_2dPoint OVar6;
  double local_40;
  
  dVar4 = P.y;
  local_40 = P.x;
  if ((*closed != false) || (closed[1] == true)) {
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      dVar3 = dVar4;
      if (closed[lVar1] == true) {
        dVar5 = local_40;
        if (lVar1 != 0) {
          dVar5 = dVar4;
        }
        dVar3 = dom->m_t[0];
        dVar2 = ON_Interval::Length(dom);
        dVar3 = floor((dVar5 - dVar3) / dVar2);
        dVar5 = dVar5 - dVar3 * dVar2;
        dVar3 = dVar5;
        if (lVar1 == 0) {
          dVar3 = dVar4;
          local_40 = dVar5;
        }
      }
      dom = dom + 1;
      dVar4 = dVar3;
    }
  }
  OVar6.y = dVar4;
  OVar6.x = local_40;
  return OVar6;
}

Assistant:

ON_2dPoint ON_LiftInverse(ON_2dPoint P, ON_Interval dom[2], bool closed[2])
{
	ON_2dPoint Q = P;
	if (closed[0] || closed[1])
	{
		for (int di = 0; di < 2; di++)
		{
			if (closed[di])
				Q[di] -= floor((Q[di] - dom[di][0]) / dom[di].Length())*dom[di].Length();

		}
	}
	return Q;
}